

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_read_format_7zip_deflate_arm64(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *_a;
  archive *a;
  archive_conflict *a_00;
  char *v2;
  la_int64_t v2_00;
  la_ssize_t v2_01;
  unsigned_long uVar4;
  archive_entry *ae;
  char buff [70368];
  archive_entry *paStack_11320;
  undefined1 auStack_11318 [70376];
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'Ң',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_gzip(_a);
  if (iVar1 == 0) {
    a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                     ,L'Ѯ',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    extract_reference_file("test_read_format_7zip_deflate_arm64.7z");
    iVar1 = archive_read_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ѳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    a_00 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                     ,L'ѳ',(uint)(a_00 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ѵ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00)
    ;
    iVar1 = archive_read_support_format_all((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ѵ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00)
    ;
    wVar2 = archive_read_open_filename(a_00,"test_read_format_7zip_deflate_arm64.7z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ѹ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a_00);
    iVar1 = archive_read_next_header((archive *)a_00,&paStack_11320);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ѻ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
    mVar3 = archive_entry_mode(paStack_11320);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ѻ',0x81fd,"(AE_IFREG | 0775)",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    v2 = archive_entry_pathname(paStack_11320);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
               ,L'Ѽ',"hw-arm64","\"hw-arm64\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v2_00 = archive_entry_size(paStack_11320);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'ѽ',0x112e0,"sizeof(buff)",v2_00,"archive_entry_size(ae)",(void *)0x0);
    v2_01 = archive_read_data((archive *)a_00,auStack_11318,0x112e0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ѿ',0x112e0,"sizeof(buff)",v2_01,
                        "archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
    uVar4 = bitcrc32(0,auStack_11318,0x112e0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'Ҁ',uVar4 & 0xffffffff,"computed_crc",0xde97d594,"expected_crc",
                        (void *)0x0);
    iVar1 = archive_file_count((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'҂',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a_00,&paStack_11320);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'҄',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
    iVar1 = archive_read_close((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'҆',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                        ,L'҇',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ҥ');
    test_skipping("7zip:deflate decoding is not supported on this platform");
  }
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ҫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_deflate_arm64)
{
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	if (ARCHIVE_OK != archive_read_support_filter_gzip(a)) {
		skipping(
		    "7zip:deflate decoding is not supported on this platform");
	} else {
		test_arm64_filter("test_read_format_7zip_deflate_arm64.7z");
	}

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}